

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_count_bits(mp_int *a)

{
  mp_digit q;
  int r;
  mp_int *a_local;
  int local_4;
  
  if (a->used == 0) {
    local_4 = 0;
  }
  else {
    r = (a->used + -1) * 0x3c;
    for (q = a->dp[a->used + -1]; q != 0; q = q >> 1) {
      r = r + 1;
    }
    local_4 = r;
  }
  return local_4;
}

Assistant:

int mp_count_bits (mp_int * a)
{
  int     r;
  mp_digit q;

  /* shortcut */
  if (a->used == 0) {
    return 0;
  }

  /* get number of digits and add that */
  r = (a->used - 1) * DIGIT_BIT;
  
  /* take the last digit and count the bits in it */
  q = a->dp[a->used - 1];
  while (q > ((mp_digit) 0)) {
    ++r;
    q >>= ((mp_digit) 1);
  }
  return r;
}